

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O3

void duckdb::HeapScatterArrayVector
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  long lVar1;
  bool bVar2;
  Vector *this;
  idx_t iVar3;
  LogicalType *other;
  idx_t iVar4;
  byte *pbVar5;
  data_ptr_t pdVar6;
  long lVar7;
  SelectionVector *pSVar8;
  byte bVar9;
  ulong uVar10;
  idx_t iVar11;
  ulong uVar12;
  idx_t vcount_00;
  data_ptr_t pdVar13;
  idx_t iVar14;
  LogicalType child_type;
  UnifiedVectorFormat vdata;
  NestedValidity array_parent_validity;
  UnifiedVectorFormat child_vdata;
  idx_t array_entry_sizes [2048];
  data_ptr_t array_entry_locations [2048];
  idx_t local_8158;
  optional_ptr<duckdb::NestedValidity,_true> local_8138;
  idx_t local_8130;
  long local_8128;
  ulong local_8120;
  SelectionVector *local_8118;
  idx_t local_8110;
  LogicalType local_8108;
  UnifiedVectorFormat local_80f0;
  NestedValidity local_80a8;
  UnifiedVectorFormat local_8080;
  idx_t local_8038 [2048];
  data_ptr_t local_4038 [2049];
  
  local_8138.ptr = parent_validity.ptr;
  local_8130 = ser_count;
  local_8118 = sel;
  this = ArrayVector::GetEntry(v);
  iVar3 = ArrayType::GetSize(&v->type);
  other = ArrayType::GetChildType(&v->type);
  LogicalType::LogicalType(&local_8108,other);
  iVar4 = GetTypeIdSize(local_8108.physical_type_);
  bVar2 = TypeIsConstantSize(local_8108.physical_type_);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_80f0);
  Vector::ToUnifiedFormat(v,vcount,&local_80f0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_8080);
  local_8110 = iVar4;
  iVar4 = ArrayVector::GetTotalSize(v);
  Vector::ToUnifiedFormat(this,iVar4,&local_8080);
  if (local_8130 != 0) {
    local_8120 = iVar3 + 7 >> 3;
    local_8128 = iVar3 * 8;
    iVar4 = 0;
    do {
      iVar14 = iVar4;
      if (local_8118->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)local_8118->sel_vector[iVar4];
      }
      uVar12 = iVar14 + offset;
      if ((local_80f0.sel)->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)(local_80f0.sel)->sel_vector[uVar12];
      }
      if (((local_8138.ptr != (NestedValidity *)0x0) &&
          (local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0)) &&
         ((local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar12 >> 6]
           >> (uVar12 & 0x3f) & 1) == 0)) {
        optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_8138);
        if ((local_8138.ptr)->list_validity_location == (data_ptr_t)0x0) {
          bVar9 = (byte)(local_8138.ptr)->idx_in_entry;
          pbVar5 = (local_8138.ptr)->struct_validity_locations[iVar4] + (local_8138.ptr)->entry_idx;
        }
        else {
          uVar10 = (local_8138.ptr)->list_validity_offset + iVar4;
          bVar9 = (byte)uVar10 & 7;
          pbVar5 = (local_8138.ptr)->list_validity_location + (uVar10 >> 3);
        }
        *pbVar5 = *pbVar5 & ~(byte)(1L << (bVar9 & 0x3f));
      }
      uVar10 = local_8120;
      pdVar13 = key_locations[iVar4];
      switchD_012e5a64::default(pdVar13,0xff,local_8120);
      key_locations[iVar4] = key_locations[iVar4] + uVar10;
      NestedValidity::NestedValidity(&local_80a8,pdVar13);
      if (bVar2) {
        pdVar13 = (data_ptr_t)0x0;
      }
      else {
        pdVar13 = key_locations[iVar4];
        key_locations[iVar4] = pdVar13 + local_8128;
      }
      if (iVar3 != 0) {
        local_8158 = uVar12 * iVar3;
        iVar14 = iVar3;
        do {
          vcount_00 = 0x800;
          if (iVar14 < 0x800) {
            vcount_00 = iVar14;
          }
          if (bVar2) {
            pdVar6 = key_locations[iVar4];
            iVar11 = 0;
            do {
              local_4038[iVar11] = pdVar6;
              pdVar6 = pdVar6 + local_8110;
              iVar11 = iVar11 + 1;
            } while (vcount_00 != iVar11);
            key_locations[iVar4] = pdVar6;
          }
          else {
            switchD_012e5a64::default(local_8038,0,vcount_00 * 8);
            pSVar8 = FlatVector::IncrementalSelectionVector();
            RowOperations::ComputeEntrySizes(this,local_8038,vcount_00,vcount_00,pSVar8,local_8158);
            lVar7 = 0;
            do {
              pdVar6 = key_locations[iVar4];
              *(data_ptr_t *)((long)local_4038 + lVar7) = pdVar6;
              lVar1 = *(long *)((long)local_8038 + lVar7);
              key_locations[iVar4] = pdVar6 + lVar1;
              *(long *)(pdVar13 + lVar7) = lVar1;
              lVar7 = lVar7 + 8;
            } while (vcount_00 * 8 - lVar7 != 0);
            pdVar13 = pdVar13 + lVar7;
          }
          iVar11 = ArrayVector::GetTotalSize(v);
          pSVar8 = FlatVector::IncrementalSelectionVector();
          RowOperations::HeapScatter(this,iVar11,pSVar8,vcount_00,local_4038,&local_80a8,local_8158)
          ;
          local_8158 = local_8158 + vcount_00;
          local_80a8.list_validity_offset = local_80a8.list_validity_offset + vcount_00;
          iVar14 = iVar14 - vcount_00;
        } while (iVar14 != 0);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != local_8130);
  }
  if (local_8080.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80f0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80f0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80f0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_8108);
  return;
}

Assistant:

static void HeapScatterArrayVector(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                   data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity,
                                   idx_t offset) {

	auto &child_vector = ArrayVector::GetEntry(v);
	auto array_size = ArrayType::GetSize(v.GetType());
	auto child_type = ArrayType::GetChildType(v.GetType());
	auto child_type_size = GetTypeIdSize(child_type.InternalType());
	auto child_type_is_var_size = !TypeIsConstantSize(child_type.InternalType());

	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);

	UnifiedVectorFormat child_vdata;
	child_vector.ToUnifiedFormat(ArrayVector::GetTotalSize(v), child_vdata);

	data_ptr_t array_entry_locations[STANDARD_VECTOR_SIZE];
	idx_t array_entry_sizes[STANDARD_VECTOR_SIZE];

	// array must have a validitymask for its elements
	auto array_validitymask_size = (array_size + 7) / 8;

	for (idx_t i = 0; i < ser_count; i++) {
		// Set if the whole array itself is null in the parent entry
		auto source_idx = vdata.sel->get_index(sel.get_index(i) + offset);
		if (parent_validity && !vdata.validity.RowIsValid(source_idx)) {
			parent_validity->SetInvalid(i);
		}

		// Now we can serialize the array itself
		// Every array starts with a validity mask for the children
		data_ptr_t array_validitymask_location = key_locations[i];
		memset(array_validitymask_location, -1, array_validitymask_size);
		key_locations[i] += array_validitymask_size;

		NestedValidity array_parent_validity(array_validitymask_location);

		// If the array contains variable size entries, we reserve spaces for them here
		data_ptr_t var_entry_size_ptr = nullptr;
		if (child_type_is_var_size) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += array_size * sizeof(idx_t);
		}

		// Then comes the elements
		auto array_start = source_idx * array_size;
		auto elem_remaining = array_size;

		while (elem_remaining > 0) {
			// the array elements can span multiple vectors, so we divide it into chunks
			auto chunk_size = MinValue(static_cast<idx_t>(STANDARD_VECTOR_SIZE), elem_remaining);

			// Setup the locations for the elements
			if (child_type_is_var_size) {
				// The elements are variable sized
				std::fill_n(array_entry_sizes, chunk_size, 0);
				RowOperations::ComputeEntrySizes(child_vector, array_entry_sizes, chunk_size, chunk_size,
				                                 *FlatVector::IncrementalSelectionVector(), array_start);
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += array_entry_sizes[elem_idx];

					// Now store the size of the entry
					Store<idx_t>(array_entry_sizes[elem_idx], var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			} else {
				// The elements are constant sized
				for (idx_t elem_idx = 0; elem_idx < chunk_size; elem_idx++) {
					array_entry_locations[elem_idx] = key_locations[i];
					key_locations[i] += child_type_size;
				}
			}

			RowOperations::HeapScatter(child_vector, ArrayVector::GetTotalSize(v),
			                           *FlatVector::IncrementalSelectionVector(), chunk_size, array_entry_locations,
			                           &array_parent_validity, array_start);

			// update for next iteration
			elem_remaining -= chunk_size;
			array_start += chunk_size;
			array_parent_validity.OffsetListBy(chunk_size);
		}
	}
}